

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_iterator.h
# Opt level: O2

void __thiscall
cfd::core::IteratorWrapper<cfd::core::ScriptElement>::IteratorWrapper
          (IteratorWrapper<cfd::core::ScriptElement> *this,
          vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *vector,
          string *error_message,bool is_reverse)

{
  pointer pSVar1;
  
  this->_vptr_IteratorWrapper = (_func_int **)&PTR__IteratorWrapper_005cc4d0;
  ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::vector
            (&this->vector_,vector);
  pSVar1 = (this->vector_).
           super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  (this->iterator_)._M_current =
       (this->vector_).
       super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->reverse_iterator_).current._M_current = pSVar1;
  ::std::__cxx11::string::string((string *)&this->error_message_,(string *)error_message);
  this->reverse_ = is_reverse;
  return;
}

Assistant:

IteratorWrapper(
      std::vector<T> vector, std::string error_message,
      bool is_reverse = false)
      : vector_(vector),
        iterator_(vector_.cbegin()),
        reverse_iterator_(vector_.crbegin()),
        error_message_(error_message),
        reverse_(is_reverse) {
    // do nothing
  }